

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePathCommand.cxx
# Opt level: O3

bool cmCMakePathCommand(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *args,cmExecutionStatus *status)

{
  pointer pbVar1;
  bool bVar2;
  int iVar3;
  string_view key;
  initializer_list<std::pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>_>
  init;
  pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
  local_280;
  undefined8 local_268;
  char *local_260;
  code *local_258;
  undefined8 local_250;
  char *local_248;
  code *local_240;
  undefined8 local_238;
  char *local_230;
  code *local_228;
  undefined8 local_220;
  char *local_218;
  code *local_210;
  undefined8 local_208;
  char *local_200;
  code *local_1f8;
  undefined8 local_1f0;
  char *local_1e8;
  code *local_1e0;
  undefined8 local_1d8;
  char *local_1d0;
  code *local_1c8;
  undefined8 local_1c0;
  char *local_1b8;
  code *local_1b0;
  undefined8 local_1a8;
  char *local_1a0;
  code *local_198;
  undefined8 local_190;
  char *local_188;
  code *local_180;
  undefined8 local_178;
  char *local_170;
  code *local_168;
  undefined8 local_160;
  char *local_158;
  code *local_150;
  undefined8 local_148;
  char *local_140;
  code *local_138;
  undefined8 local_130;
  char *local_128;
  code *local_120;
  undefined8 local_118;
  char *local_110;
  code *local_108;
  undefined8 local_100;
  char *local_f8;
  code *local_f0;
  undefined8 local_e8;
  char *local_e0;
  code *local_d8;
  undefined8 local_d0;
  char *local_c8;
  code *local_c0;
  undefined8 local_b8;
  char *local_b0;
  code *local_a8;
  undefined8 local_a0;
  char *local_98;
  code *local_90;
  undefined8 local_88;
  char *local_80;
  code *local_78;
  undefined8 local_70;
  char *local_68;
  code *local_60;
  undefined8 local_58;
  char *local_50;
  code *local_48;
  undefined8 local_40;
  char *local_38;
  code *local_30;
  undefined8 local_28;
  char *local_20;
  code *local_18;
  
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
             (long)(args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start) < 0x21) {
    local_280.first.super_string_view._M_len = (size_t)&local_280.second;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_280,"must be called with at least two arguments.","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((_func_bool_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_ptr_cmExecutionStatus_ptr
         **)local_280.first.super_string_view._M_len != &local_280.second) {
      operator_delete((void *)local_280.first.super_string_view._M_len,(ulong)(local_280.second + 1)
                     );
    }
    bVar2 = false;
  }
  else {
    if (cmCMakePathCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
        ::subcommand == '\0') {
      iVar3 = __cxa_guard_acquire(&cmCMakePathCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                   ::subcommand);
      if (iVar3 != 0) {
        local_280.first.super_string_view._M_len = 3;
        local_280.first.super_string_view._M_str = "GET";
        local_280.second = anon_unknown.dwarf_7ae818::HandleGetCommand;
        local_268 = 3;
        local_260 = "SET";
        local_258 = anon_unknown.dwarf_7ae818::HandleSetCommand;
        local_250 = 6;
        local_248 = "APPEND";
        local_240 = anon_unknown.dwarf_7ae818::HandleAppendCommand;
        local_238 = 0xd;
        local_230 = "APPEND_STRING";
        local_228 = anon_unknown.dwarf_7ae818::HandleAppendStringCommand;
        local_220 = 0xf;
        local_218 = "REMOVE_FILENAME";
        local_210 = anon_unknown.dwarf_7ae818::HandleRemoveFilenameCommand;
        local_208 = 0x10;
        local_200 = "REPLACE_FILENAME";
        local_1f8 = anon_unknown.dwarf_7ae818::HandleReplaceFilenameCommand;
        local_1f0 = 0x10;
        local_1e8 = "REMOVE_EXTENSION";
        local_1e0 = anon_unknown.dwarf_7ae818::HandleRemoveExtensionCommand;
        local_1d8 = 0x11;
        local_1d0 = "REPLACE_EXTENSION";
        local_1c8 = anon_unknown.dwarf_7ae818::HandleReplaceExtensionCommand;
        local_1c0 = 0xb;
        local_1b8 = "NORMAL_PATH";
        local_1b0 = anon_unknown.dwarf_7ae818::HandleNormalPathCommand;
        local_1a8 = 0xd;
        local_1a0 = "RELATIVE_PATH";
        local_198 = anon_unknown.dwarf_7ae818::HandleRelativePathCommand;
        local_190 = 0xd;
        local_188 = "ABSOLUTE_PATH";
        local_180 = anon_unknown.dwarf_7ae818::HandleAbsolutePathCommand;
        local_178 = 0xb;
        local_170 = "NATIVE_PATH";
        local_168 = anon_unknown.dwarf_7ae818::HandleNativePathCommand;
        local_160 = 7;
        local_158 = "CONVERT";
        local_150 = anon_unknown.dwarf_7ae818::HandleConvertCommand;
        local_148 = 7;
        local_140 = "COMPARE";
        local_138 = anon_unknown.dwarf_7ae818::HandleCompareCommand;
        local_130 = 0xd;
        local_128 = "HAS_ROOT_NAME";
        local_120 = anon_unknown.dwarf_7ae818::HandleHasRootNameCommand;
        local_118 = 0x12;
        local_110 = "HAS_ROOT_DIRECTORY";
        local_108 = anon_unknown.dwarf_7ae818::HandleHasRootDirectoryCommand;
        local_100 = 0xd;
        local_f8 = "HAS_ROOT_PATH";
        local_f0 = anon_unknown.dwarf_7ae818::HandleHasRootPathCommand;
        local_e8 = 0xc;
        local_e0 = "HAS_FILENAME";
        local_d8 = anon_unknown.dwarf_7ae818::HandleHasFilenameCommand;
        local_d0 = 0xd;
        local_c8 = "HAS_EXTENSION";
        local_c0 = anon_unknown.dwarf_7ae818::HandleHasExtensionCommand;
        local_b8 = 8;
        local_b0 = "HAS_STEM";
        local_a8 = anon_unknown.dwarf_7ae818::HandleHasStemCommand;
        local_a0 = 0x11;
        local_98 = "HAS_RELATIVE_PART";
        local_90 = anon_unknown.dwarf_7ae818::HandleHasRelativePartCommand;
        local_88 = 0xf;
        local_80 = "HAS_PARENT_PATH";
        local_78 = anon_unknown.dwarf_7ae818::HandleHasParentPathCommand;
        local_70 = 0xb;
        local_68 = "IS_ABSOLUTE";
        local_60 = anon_unknown.dwarf_7ae818::HandleIsAbsoluteCommand;
        local_58 = 0xb;
        local_50 = "IS_RELATIVE";
        local_48 = anon_unknown.dwarf_7ae818::HandleIsRelativeCommand;
        local_40 = 9;
        local_38 = "IS_PREFIX";
        local_30 = anon_unknown.dwarf_7ae818::HandleIsPrefixCommand;
        local_28 = 4;
        local_20 = "HASH";
        local_18 = anon_unknown.dwarf_7ae818::HandleHashCommand;
        init._M_len = 0x1a;
        init._M_array = &local_280;
        cmSubcommandTable::cmSubcommandTable(&cmCMakePathCommand::subcommand,init);
        __cxa_atexit(cmSubcommandTable::~cmSubcommandTable,&cmCMakePathCommand::subcommand,
                     &__dso_handle);
        __cxa_guard_release(&cmCMakePathCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                             ::subcommand);
      }
    }
    pbVar1 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    key._M_str = (pbVar1->_M_dataplus)._M_p;
    key._M_len = pbVar1->_M_string_length;
    bVar2 = cmSubcommandTable::operator()(&cmCMakePathCommand::subcommand,key,args,status);
  }
  return bVar2;
}

Assistant:

bool cmCMakePathCommand(std::vector<std::string> const& args,
                        cmExecutionStatus& status)
{
  if (args.size() < 2) {
    status.SetError("must be called with at least two arguments.");
    return false;
  }

  static cmSubcommandTable const subcommand{
    { "GET"_s, HandleGetCommand },
    { "SET"_s, HandleSetCommand },
    { "APPEND"_s, HandleAppendCommand },
    { "APPEND_STRING"_s, HandleAppendStringCommand },
    { "REMOVE_FILENAME"_s, HandleRemoveFilenameCommand },
    { "REPLACE_FILENAME"_s, HandleReplaceFilenameCommand },
    { "REMOVE_EXTENSION"_s, HandleRemoveExtensionCommand },
    { "REPLACE_EXTENSION"_s, HandleReplaceExtensionCommand },
    { "NORMAL_PATH"_s, HandleNormalPathCommand },
    { "RELATIVE_PATH"_s, HandleRelativePathCommand },
    { "ABSOLUTE_PATH"_s, HandleAbsolutePathCommand },
    { "NATIVE_PATH"_s, HandleNativePathCommand },
    { "CONVERT"_s, HandleConvertCommand },
    { "COMPARE"_s, HandleCompareCommand },
    { "HAS_ROOT_NAME"_s, HandleHasRootNameCommand },
    { "HAS_ROOT_DIRECTORY"_s, HandleHasRootDirectoryCommand },
    { "HAS_ROOT_PATH"_s, HandleHasRootPathCommand },
    { "HAS_FILENAME"_s, HandleHasFilenameCommand },
    { "HAS_EXTENSION"_s, HandleHasExtensionCommand },
    { "HAS_STEM"_s, HandleHasStemCommand },
    { "HAS_RELATIVE_PART"_s, HandleHasRelativePartCommand },
    { "HAS_PARENT_PATH"_s, HandleHasParentPathCommand },
    { "IS_ABSOLUTE"_s, HandleIsAbsoluteCommand },
    { "IS_RELATIVE"_s, HandleIsRelativeCommand },
    { "IS_PREFIX"_s, HandleIsPrefixCommand },
    { "HASH"_s, HandleHashCommand }
  };

  return subcommand(args[0], args, status);
}